

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>
::UntypedPerformAction
          (FunctionMockerBase<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *pAVar1;
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> action;
  linked_ptr<testing::ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>_>
  ::linked_ptr(&local_20,
               (linked_ptr<testing::ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>_>
                *)untyped_action);
  pAVar1 = ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>>::
           PerformAction<std::experimental::fundamentals_v1::optional<InotifyEvent>()>
                     ((Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *)
                      &local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>_>
  ::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }